

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters::ByteSizeLong(TreeEnsembleParameters *this)

{
  long lVar1;
  uint uVar2;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  uint i;
  uint index;
  ulong uVar5;
  int value_00;
  
  uVar2 = (this->nodes_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar2;
  for (index = 0; uVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                      (&(this->nodes_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters_TreeNode>(value);
    uVar5 = uVar5 + sVar3;
  }
  uVar4 = (ulong)(uint)(this->basepredictionvalue_).current_size_;
  lVar1 = uVar4 * 8;
  if (uVar4 == 0) {
    value_00 = 0;
  }
  else {
    value_00 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    uVar5 = uVar5 + sVar3 + 1;
  }
  this->_basepredictionvalue_cached_byte_size_ = value_00;
  sVar3 = uVar5 + lVar1;
  if (this->numpredictiondimensions_ != 0) {
    uVar5 = this->numpredictiondimensions_ | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t TreeEnsembleParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  {
    unsigned int count = this->nodes_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nodes(i));
    }
  }

  // repeated double basePredictionValue = 3;
  {
    unsigned int count = this->basepredictionvalue_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _basepredictionvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numpredictiondimensions());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}